

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

void __thiscall
pbrt::LightBounds::LightBounds
          (LightBounds *this,Bounds3f *b,Vector3f *w,Float phi,Float theta_o,Float theta_e,
          bool twoSided)

{
  undefined8 uVar1;
  ulong uVar2;
  float fVar3;
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  
  fVar3 = (b->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.y = (b->pMax).super_Tuple3<pbrt::Point3,_float>.y
  ;
  (this->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (b->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar2 = *(ulong *)&(b->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  auVar5 = ZEXT856(uVar2);
  (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (b->pMin).super_Tuple3<pbrt::Point3,_float>.x
  ;
  (this->b).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(ulong *)&(this->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar2;
  VVar6 = Normalize<float>(w);
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (this->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->w).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->w).super_Tuple3<pbrt::Vector3,_float>.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  this->phi = phi;
  this->theta_o = theta_o;
  this->theta_e = theta_e;
  fVar3 = cosf(theta_o);
  this->cosTheta_o = fVar3;
  fVar3 = cosf(theta_e);
  this->cosTheta_e = fVar3;
  this->twoSided = twoSided;
  return;
}

Assistant:

LightBounds(const Bounds3f &b, const Vector3f &w, Float phi, Float theta_o,
                Float theta_e, bool twoSided)
        : b(b),
          w(Normalize(w)),
          phi(phi),
          theta_o(theta_o),
          theta_e(theta_e),
          cosTheta_o(std::cos(theta_o)),
          cosTheta_e(std::cos(theta_e)),
          twoSided(twoSided) {}